

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

int BN_bn2mpi(BIGNUM *a,uchar *to)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t len;
  int extend;
  size_t bytes;
  size_t bits;
  uint8_t *out_local;
  BIGNUM *in_local;
  
  uVar1 = BN_num_bits(a);
  uVar2 = (ulong)uVar1 + 7 >> 3;
  len._4_4_ = 0;
  if ((uVar2 != 0) && ((uVar1 & 7) == 0)) {
    len._4_4_ = 1;
  }
  uVar3 = uVar2 + (long)len._4_4_;
  if ((uVar3 < uVar2) || (uVar3 + 4 < uVar3)) {
    if (to != (uchar *)0x0) {
      OPENSSL_memset(to,0,4);
    }
    in_local._0_4_ = 4;
  }
  else if (to == (uchar *)0x0) {
    in_local._0_4_ = (int)uVar3 + 4;
  }
  else {
    *to = (uchar)(uVar3 >> 0x18);
    to[1] = (uchar)(uVar3 >> 0x10);
    to[2] = (uchar)(uVar3 >> 8);
    to[3] = (uchar)uVar3;
    if (len._4_4_ != 0) {
      to[4] = '\0';
    }
    BN_bn2bin(a,to + (long)len._4_4_ + 4);
    if ((a->neg != 0) && (uVar3 != 0)) {
      to[4] = to[4] | 0x80;
    }
    in_local._0_4_ = (int)uVar3 + 4;
  }
  return (int)in_local;
}

Assistant:

size_t BN_bn2mpi(const BIGNUM *in, uint8_t *out) {
  const size_t bits = BN_num_bits(in);
  const size_t bytes = (bits + 7) / 8;
  // If the number of bits is a multiple of 8, i.e. if the MSB is set,
  // prefix with a zero byte.
  int extend = 0;
  if (bytes != 0 && (bits & 0x07) == 0) {
    extend = 1;
  }

  const size_t len = bytes + extend;
  if (len < bytes || 4 + len < len || (len & 0xffffffff) != len) {
    // If we cannot represent the number then we emit zero as the interface
    // doesn't allow an error to be signalled.
    if (out) {
      OPENSSL_memset(out, 0, 4);
    }
    return 4;
  }

  if (out == NULL) {
    return 4 + len;
  }

  out[0] = len >> 24;
  out[1] = len >> 16;
  out[2] = len >> 8;
  out[3] = len;
  if (extend) {
    out[4] = 0;
  }
  BN_bn2bin(in, out + 4 + extend);
  if (in->neg && len > 0) {
    out[4] |= 0x80;
  }
  return len + 4;
}